

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderRenderingTrianglesCase::setUniformsBeforeDrawCall
          (GeometryShaderRenderingTrianglesCase *this,_draw_call_type drawcall_type)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  RenderContext *pRVar12;
  undefined4 extraout_var;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  bool bVar14;
  bool local_61;
  bool local_49;
  GLint is_triangles_output_uniform_location;
  GLint is_triangles_input_uniform_location;
  GLint is_triangles_adjacency_input_uniform_location;
  GLint is_triangle_strip_adjacency_input_uniform_location;
  GLint is_triangle_strip_input_uniform_location;
  GLint is_triangle_fan_input_uniform_location;
  GLint is_points_output_uniform_location;
  GLint is_instanced_draw_call_uniform_location;
  GLint is_indexed_draw_call_uniform_location;
  GLint is_lines_output_uniform_location;
  Functions *gl;
  _draw_call_type drawcall_type_local;
  GeometryShaderRenderingTrianglesCase *this_local;
  long lVar13;
  
  pRVar12 = deqp::Context::getRenderContext((this->super_GeometryShaderRenderingCase).m_context);
  iVar1 = (*pRVar12->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar1);
  uVar2 = (**(code **)(lVar13 + 0xb48))
                    ((this->super_GeometryShaderRenderingCase).m_po_id,"is_lines_output");
  uVar3 = (**(code **)(lVar13 + 0xb48))
                    ((this->super_GeometryShaderRenderingCase).m_po_id,"is_indexed_draw_call");
  uVar4 = (**(code **)(lVar13 + 0xb48))
                    ((this->super_GeometryShaderRenderingCase).m_po_id,"is_instanced_draw_call");
  uVar5 = (**(code **)(lVar13 + 0xb48))
                    ((this->super_GeometryShaderRenderingCase).m_po_id,"is_points_output");
  uVar6 = (**(code **)(lVar13 + 0xb48))
                    ((this->super_GeometryShaderRenderingCase).m_po_id,"is_triangle_fan_input");
  uVar7 = (**(code **)(lVar13 + 0xb48))
                    ((this->super_GeometryShaderRenderingCase).m_po_id,"is_triangle_strip_input");
  uVar8 = (**(code **)(lVar13 + 0xb48))
                    ((this->super_GeometryShaderRenderingCase).m_po_id,
                     "is_triangle_strip_adjacency_input");
  uVar9 = (**(code **)(lVar13 + 0xb48))
                    ((this->super_GeometryShaderRenderingCase).m_po_id,
                     "is_triangles_adjacency_input");
  uVar10 = (**(code **)(lVar13 + 0xb48))
                     ((this->super_GeometryShaderRenderingCase).m_po_id,"is_triangles_input");
  uVar11 = (**(code **)(lVar13 + 0xb48))
                     ((this->super_GeometryShaderRenderingCase).m_po_id,"is_triangles_output");
  bVar14 = *(int *)&(this->super_GeometryShaderRenderingCase).field_0x304 == 1;
  (**(code **)(lVar13 + 0x14f0))(uVar2,bVar14,extraout_RDX,bVar14);
  bVar14 = *(int *)&(this->super_GeometryShaderRenderingCase).field_0x304 == 0;
  (**(code **)(lVar13 + 0x14f0))(uVar5,bVar14,extraout_RDX_00,bVar14);
  bVar14 = this->m_drawcall_mode == 6;
  (**(code **)(lVar13 + 0x14f0))(uVar6,bVar14,extraout_RDX_01,bVar14);
  bVar14 = this->m_drawcall_mode == 5;
  (**(code **)(lVar13 + 0x14f0))(uVar7,bVar14,extraout_RDX_02,bVar14);
  bVar14 = this->m_drawcall_mode == 0xc;
  (**(code **)(lVar13 + 0x14f0))(uVar9,bVar14,extraout_RDX_03,bVar14);
  bVar14 = this->m_drawcall_mode == 0xd;
  (**(code **)(lVar13 + 0x14f0))(uVar8,bVar14,extraout_RDX_04,bVar14);
  bVar14 = this->m_drawcall_mode == 4;
  (**(code **)(lVar13 + 0x14f0))(uVar10,bVar14,extraout_RDX_05,bVar14);
  bVar14 = *(int *)&(this->super_GeometryShaderRenderingCase).field_0x304 == 2;
  (**(code **)(lVar13 + 0x14f0))(uVar11,bVar14,extraout_RDX_06,bVar14);
  local_49 = true;
  if ((drawcall_type != DRAW_CALL_TYPE_GL_DRAW_ELEMENTS) &&
     (local_49 = true, drawcall_type != DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED)) {
    local_49 = drawcall_type == DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS;
  }
  (**(code **)(lVar13 + 0x14f0))(uVar3,local_49,extraout_RDX_07,local_49);
  local_61 = drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ARRAYS_INSTANCED ||
             drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED;
  (**(code **)(lVar13 + 0x14f0))(uVar4,local_61,extraout_RDX_08,local_61);
  return;
}

Assistant:

void GeometryShaderRenderingTrianglesCase::setUniformsBeforeDrawCall(_draw_call_type drawcall_type)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLint is_lines_output_uniform_location			= gl.getUniformLocation(m_po_id, "is_lines_output");
	glw::GLint is_indexed_draw_call_uniform_location	= gl.getUniformLocation(m_po_id, "is_indexed_draw_call");
	glw::GLint is_instanced_draw_call_uniform_location  = gl.getUniformLocation(m_po_id, "is_instanced_draw_call");
	glw::GLint is_points_output_uniform_location		= gl.getUniformLocation(m_po_id, "is_points_output");
	glw::GLint is_triangle_fan_input_uniform_location   = gl.getUniformLocation(m_po_id, "is_triangle_fan_input");
	glw::GLint is_triangle_strip_input_uniform_location = gl.getUniformLocation(m_po_id, "is_triangle_strip_input");
	glw::GLint is_triangle_strip_adjacency_input_uniform_location =
		gl.getUniformLocation(m_po_id, "is_triangle_strip_adjacency_input");
	glw::GLint is_triangles_adjacency_input_uniform_location =
		gl.getUniformLocation(m_po_id, "is_triangles_adjacency_input");
	glw::GLint is_triangles_input_uniform_location  = gl.getUniformLocation(m_po_id, "is_triangles_input");
	glw::GLint is_triangles_output_uniform_location = gl.getUniformLocation(m_po_id, "is_triangles_output");

	gl.uniform1i(is_lines_output_uniform_location, m_output_type == SHADER_OUTPUT_TYPE_LINE_STRIP);
	gl.uniform1i(is_points_output_uniform_location, m_output_type == SHADER_OUTPUT_TYPE_POINTS);
	gl.uniform1i(is_triangle_fan_input_uniform_location, m_drawcall_mode == GL_TRIANGLE_FAN);
	gl.uniform1i(is_triangle_strip_input_uniform_location, m_drawcall_mode == GL_TRIANGLE_STRIP);
	gl.uniform1i(is_triangles_adjacency_input_uniform_location, m_drawcall_mode == GL_TRIANGLES_ADJACENCY_EXT);
	gl.uniform1i(is_triangle_strip_adjacency_input_uniform_location,
				 m_drawcall_mode == GL_TRIANGLE_STRIP_ADJACENCY_EXT);
	gl.uniform1i(is_triangles_input_uniform_location, m_drawcall_mode == GL_TRIANGLES);
	gl.uniform1i(is_triangles_output_uniform_location, m_output_type == SHADER_OUTPUT_TYPE_TRIANGLE_STRIP);
	gl.uniform1i(is_indexed_draw_call_uniform_location, (drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS ||
														 drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED ||
														 drawcall_type == DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS));
	gl.uniform1i(is_instanced_draw_call_uniform_location,
				 (drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ARRAYS_INSTANCED) ||
					 (drawcall_type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED));
}